

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_encoder.h
# Opt level: O0

void __thiscall draco::DirectBitEncoder::EncodeBit(DirectBitEncoder *this,bool bit)

{
  byte in_SIL;
  value_type_conflict5 *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unaff_retaddr;
  
  if ((in_SIL & 1) != 0) {
    in_RDI[6] = 1 << (0x1fU - (char)in_RDI[7] & 0x1f) | in_RDI[6];
  }
  in_RDI[7] = in_RDI[7] + 1;
  if (in_RDI[7] == 0x20) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(unaff_retaddr,in_RDI);
    in_RDI[7] = 0;
    in_RDI[6] = 0;
  }
  return;
}

Assistant:

void EncodeBit(bool bit) {
    if (bit) {
      local_bits_ |= 1 << (31 - num_local_bits_);
    }
    num_local_bits_++;
    if (num_local_bits_ == 32) {
      bits_.push_back(local_bits_);
      num_local_bits_ = 0;
      local_bits_ = 0;
    }
  }